

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_serialiserscommon.cpp
# Opt level: O0

QAbstractItemModel * __thiscall
tst_SerialiserCommon::createComplexModel
          (tst_SerialiserCommon *this,bool tree,bool multiRoles,QObject *parent)

{
  int iVar1;
  int iVar2;
  QStandardItemModel *pQVar3;
  int iVar4;
  QVariant local_1e0;
  QLatin1Char local_1bb;
  QChar local_1ba;
  QArrayDataPointer<char16_t> local_1b8;
  QString local_1a0;
  QString local_188;
  QVariant local_170;
  QModelIndex local_150;
  int local_134;
  undefined1 local_130 [4];
  int i_1;
  QLatin1Char local_10b;
  QChar local_10a;
  QArrayDataPointer<char16_t> local_108;
  QString local_f0;
  QString local_d8;
  QVariant local_c0;
  QModelIndex local_a0;
  int local_84;
  int i;
  QStandardItemModel *local_58;
  ComplexModel *result;
  QObject *parent_local;
  bool multiRoles_local;
  tst_SerialiserCommon *ptStack_40;
  bool tree_local;
  tst_SerialiserCommon *this_local;
  char16_t *str_1;
  QArrayDataPointer<char16_t> *local_28;
  char16_t *local_20;
  char16_t *str;
  QArrayDataPointer<char16_t> *local_10;
  
  result = (ComplexModel *)parent;
  parent_local._6_1_ = multiRoles;
  parent_local._7_1_ = tree;
  ptStack_40 = this;
  pQVar3 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(pQVar3,(QObject *)result);
  local_58 = pQVar3;
  QModelIndex::QModelIndex((QModelIndex *)&stack0xffffffffffffff80);
  iVar4 = 0;
  if ((parent_local._7_1_ & 1) != 0) {
    iVar4 = 2;
  }
  insertBranch(this,(QAbstractItemModel *)pQVar3,(QModelIndex *)&stack0xffffffffffffff80,
               (bool)(parent_local._6_1_ & 1),iVar4);
  local_84 = 0;
  while( true ) {
    pQVar3 = local_58;
    iVar4 = local_84;
    QModelIndex::QModelIndex(&local_a0);
    iVar2 = (**(code **)(*(long *)pQVar3 + 0x78))(pQVar3,&local_a0);
    pQVar3 = local_58;
    iVar1 = local_84;
    if (iVar2 <= iVar4) break;
    str = L"Row %1";
    local_20 = L"Row %1";
    local_10 = &local_108;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_108,(Data *)0x0,L"Row %1",6);
    QString::QString(&local_f0,&local_108);
    iVar4 = local_84;
    QLatin1Char::QLatin1Char(&local_10b,' ');
    QChar::QChar(&local_10a,local_10b);
    QString::arg(&local_d8,&local_f0,iVar4,0,10,local_10a);
    QVariant::QVariant(&local_c0,(QString *)&local_d8);
    (**(code **)(*(long *)pQVar3 + 0xa8))(pQVar3,iVar1,2,&local_c0);
    QVariant::~QVariant(&local_c0);
    QString::~QString(&local_d8);
    QString::~QString(&local_f0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
    pQVar3 = local_58;
    iVar4 = local_84;
    if ((parent_local._6_1_ & 1) != 0) {
      QVariant::QVariant((QVariant *)local_130,local_84);
      (**(code **)(*(long *)pQVar3 + 0xa8))(pQVar3,iVar4,2,(QVariant *)local_130,0x100);
      QVariant::~QVariant((QVariant *)local_130);
    }
    local_84 = local_84 + 1;
  }
  local_134 = 0;
  while( true ) {
    pQVar3 = local_58;
    iVar4 = local_134;
    QModelIndex::QModelIndex(&local_150);
    iVar2 = (**(code **)(*(long *)pQVar3 + 0x80))(pQVar3,&local_150);
    pQVar3 = local_58;
    iVar1 = local_134;
    if (iVar2 <= iVar4) break;
    str_1 = L"Column %1";
    this_local = (tst_SerialiserCommon *)anon_var_dwarf_3d7c6;
    local_28 = &local_1b8;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_1b8,(Data *)0x0,L"Column %1",9);
    QString::QString(&local_1a0,&local_1b8);
    iVar4 = local_134;
    QLatin1Char::QLatin1Char(&local_1bb,' ');
    QChar::QChar(&local_1ba,local_1bb);
    QString::arg(&local_188,&local_1a0,iVar4,0,10,local_1ba);
    QVariant::QVariant(&local_170,(QString *)&local_188);
    (**(code **)(*(long *)pQVar3 + 0xa8))(pQVar3,iVar1,1,&local_170,2);
    QVariant::~QVariant(&local_170);
    QString::~QString(&local_188);
    QString::~QString(&local_1a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1b8);
    pQVar3 = local_58;
    iVar4 = local_134;
    if ((parent_local._6_1_ & 1) != 0) {
      QVariant::QVariant(&local_1e0,local_134);
      (**(code **)(*(long *)pQVar3 + 0xa8))(pQVar3,iVar4,1,&local_1e0,0x100);
      QVariant::~QVariant(&local_1e0);
    }
    local_134 = local_134 + 1;
  }
  return (QAbstractItemModel *)local_58;
}

Assistant:

QAbstractItemModel *tst_SerialiserCommon::createComplexModel(bool tree, bool multiRoles, QObject *parent)
{
    ComplexModel *result = new ComplexModel(parent);
    insertBranch(result, QModelIndex(), multiRoles, tree ? 2 : 0);
    for (int i = 0; i < result->rowCount(); ++i) {
        result->setHeaderData(i, Qt::Vertical, QStringLiteral("Row %1").arg(i));
        if (multiRoles)
            result->setHeaderData(i, Qt::Vertical, i, Qt::UserRole);
    }
    for (int i = 0; i < result->columnCount(); ++i) {
        result->setHeaderData(i, Qt::Horizontal, QStringLiteral("Column %1").arg(i));
        if (multiRoles)
            result->setHeaderData(i, Qt::Horizontal, i, Qt::UserRole);
    }
    return result;
}